

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproperty.cpp
# Opt level: O2

void QtPrivate::BindableWarnings::printMetaTypeMismatch(QMetaType actual,QMetaType expected)

{
  QDebug *pQVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  QDebug local_28;
  char *local_20;
  
  local_20 = *(char **)(in_FS_OFFSET + 0x28);
  lcQPropertyBinding();
  if (((byte)lcQPropertyBinding::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) !=
      0) {
    QMessageLogger::warning((QMessageLogger *)&local_28);
    pQVar1 = QDebug::operator<<(&local_28,
                                "setBinding: Could not set binding as the property expects it to be of type"
                               );
    if (actual.d_ptr == (QMetaTypeInterface *)0x0) {
      pcVar2 = (char *)0x0;
    }
    else {
      pcVar2 = (actual.d_ptr)->name;
    }
    pQVar1 = QDebug::operator<<(pQVar1,pcVar2);
    pQVar1 = QDebug::operator<<(pQVar1,"but got");
    if (expected.d_ptr == (QMetaTypeInterface *)0x0) {
      pcVar2 = (char *)0x0;
    }
    else {
      pcVar2 = (expected.d_ptr)->name;
    }
    pQVar1 = QDebug::operator<<(pQVar1,pcVar2);
    QDebug::operator<<(pQVar1,"instead.");
    QDebug::~QDebug(&local_28);
  }
  if (*(char **)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void printMetaTypeMismatch(QMetaType actual, QMetaType expected)
{
    qCWarning(lcQPropertyBinding) << "setBinding: Could not set binding as the property expects it to be of type"
                                  << actual.name()
                                  << "but got" << expected.name() << "instead.";
}